

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::javanano::GenerateGetBit_abi_cxx11_
          (string *__return_storage_ptr__,javanano *this,int bit_index)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string mask;
  string var_name;
  
  GetBitFieldNameForBit_abi_cxx11_(&var_name,this,bit_index);
  std::__cxx11::string::string
            ((string *)&mask,
             *(char **)(kBitMasks +
                       (long)(int)((long)((ulong)(uint)((int)this >> 0x1f) << 0x20 |
                                         (ulong)this & 0xffffffff) % 0x20) * 8),
             (allocator *)&local_b0);
  std::operator+(&local_90,"((",&var_name);
  std::operator+(&local_70,&local_90," & ");
  std::operator+(&local_b0,&local_70,&mask);
  std::operator+(__return_storage_ptr__,&local_b0,") != 0)");
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&mask);
  std::__cxx11::string::~string((string *)&var_name);
  return __return_storage_ptr__;
}

Assistant:

string GenerateGetBit(int bit_index) {
  string var_name = GetBitFieldNameForBit(bit_index);
  int bit_in_var_index = bit_index % 32;

  string mask = kBitMasks[bit_in_var_index];
  string result = "((" + var_name + " & " + mask + ") != 0)";
  return result;
}